

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O1

string * strStatus_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<FileStatus,_std::allocator<FileStatus>_> *result)

{
  int iVar1;
  pointer pFVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pFVar2 = (result->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
      super__Vector_impl_data._M_finish != pFVar2) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      iVar1 = *(int *)((long)&pFVar2->status + lVar7);
      if (iVar1 == 2) {
        pcVar6 = "M ";
LAB_001089f3:
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar6,2);
      }
      else {
        pcVar6 = "R ";
        if (iVar1 == 1) goto LAB_001089f3;
        if (iVar1 == 0) {
          pcVar6 = "A ";
          goto LAB_001089f3;
        }
      }
      pFVar2 = (result->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
               super__Vector_impl_data._M_start;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,*(char **)((long)&(pFVar2->filename)._M_dataplus._M_p + lVar7),
                          *(long *)((long)&(pFVar2->filename)._M_string_length + lVar7));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
      pFVar2 = (result->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(result->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pFVar2 >> 3) * -0x3333333333333333;
      lVar7 = lVar7 + 0x28;
    } while (uVar5 <= uVar4 && uVar4 - uVar5 != 0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

String strStatus(Vector<FileStatus> result){
    std::stringstream ss;
    for(int i = 0; i < result.size();i++){
        switch(result[i].status){
            case added:
                ss << "A ";
                break;
            case removed:
                ss << "R ";
                break;
            case modified:
                ss << "M ";
                break;
            case none:break;
        }
        ss << result[i].filename << Endl;
    }
    return ss.str();
}